

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

void quantize_row_q4_K_ref(float *x,block_q4_K *y,int64_t k)

{
  block_q4_K *pbVar1;
  block_q4_K *pbVar2;
  ggml_fp16_t gVar3;
  ggml_fp16_t gVar4;
  int l;
  long lVar5;
  ulong uVar6;
  byte bVar7;
  int j_3;
  ulong uVar8;
  uint uVar9;
  uint8_t *puVar10;
  int j;
  long lVar11;
  uint8_t *puVar12;
  float *pfVar13;
  uint8_t *puVar14;
  float fVar15;
  float in_XMM1_Da;
  float fVar16;
  uint8_t m;
  uint8_t sc;
  float local_244;
  ulong local_240;
  ulong local_238;
  block_q4_K *local_230;
  ulong local_228;
  float *local_220;
  float scales [8];
  float mins [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  
  local_238 = 0;
  local_228 = k / 0x100 & 0xffffffff;
  if ((int)(k / 0x100) < 1) {
    local_228 = local_238;
  }
  puVar10 = y->scales + 4;
  local_230 = y;
  for (; local_238 != local_228; local_238 = local_238 + 1) {
    fVar16 = 0.0;
    pfVar13 = x;
    local_244 = 0.0;
    for (lVar11 = 0; uVar8 = local_238, lVar11 != 8; lVar11 = lVar11 + 1) {
      fVar15 = 0.0;
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        in_XMM1_Da = pfVar13[lVar5] * pfVar13[lVar5];
        fVar15 = fVar15 + in_XMM1_Da;
      }
      fVar15 = fVar15 * 0.03125;
      local_240 = CONCAT44(local_240._4_4_,fVar16);
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
        in_XMM1_Da = ABS(pfVar13[lVar5]) + fVar15;
        weights[lVar5] = in_XMM1_Da;
      }
      fVar16 = make_qkx2_quants(0x20,0xf,x + lVar11 * 0x20,weights,L + lVar11 * 0x20,mins + lVar11,
                                Laux,-1.0,in_XMM1_Da,0x14,false);
      scales[lVar11] = fVar16;
      if (fVar16 <= (float)local_240) {
        fVar16 = (float)local_240;
      }
      in_XMM1_Da = mins[lVar11];
      if (in_XMM1_Da <= local_244) {
        in_XMM1_Da = local_244;
      }
      pfVar13 = pfVar13 + 0x20;
      local_244 = in_XMM1_Da;
    }
    in_XMM1_Da = (float)(-(uint)(0.0 < local_244) & (uint)(63.0 / local_244));
    for (uVar6 = 0; uVar6 != 8; uVar6 = uVar6 + 1) {
      fVar15 = scales[uVar6] * (float)(-(uint)(0.0 < fVar16) & (uint)(63.0 / fVar16)) + 12582912.0;
      bVar7 = SUB41(fVar15,0);
      if (0x3e < ((uint)fVar15 & 0xff)) {
        bVar7 = 0x3f;
      }
      uVar9 = (uint)(mins[uVar6] * in_XMM1_Da + 12582912.0) & 0xff;
      if (0x3e < uVar9) {
        uVar9 = 0x3f;
      }
      if (uVar6 < 4) {
        puVar10[uVar6 - 4] = bVar7;
        puVar10[uVar6] = (byte)uVar9;
      }
      else {
        puVar10[uVar6] = (byte)(uVar9 << 4) | bVar7 & 0xf;
        puVar10[uVar6 - 8] = puVar10[uVar6 - 8] | (bVar7 & 0x30) << 2;
        puVar10[uVar6 - 4] = puVar10[uVar6 - 4] | ((byte)uVar9 & 0x30) << 2;
      }
    }
    gVar3 = ggml_compute_fp32_to_fp16(fVar16 / 63.0);
    pbVar2 = local_230;
    pbVar1 = local_230 + uVar8;
    (pbVar1->field_0).field_0.d = gVar3;
    gVar4 = ggml_compute_fp32_to_fp16(local_244 / 63.0);
    (pbVar1->field_0).field_0.dmin = gVar4;
    local_244 = ggml_table_f32_f16[gVar3];
    local_240 = (ulong)gVar4;
    puVar12 = L;
    local_220 = x;
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      get_scale_min_k4((int)lVar11,pbVar1->scales,&sc,&m);
      fVar16 = (float)sc * local_244;
      if ((fVar16 != 0.0) || (NAN(fVar16))) {
        in_XMM1_Da = (float)m * ggml_table_f32_f16[local_240];
        for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 1) {
          uVar9 = (uint)((x[lVar5] + in_XMM1_Da) / fVar16 + 12582912.0) & 0x7fffff;
          if (0x40000e < uVar9) {
            uVar9 = 0x40000f;
          }
          if (uVar9 < 0x400001) {
            uVar9 = 0;
          }
          puVar12[lVar5] = (uint8_t)uVar9;
        }
      }
      puVar12 = puVar12 + 0x20;
      x = x + 0x20;
    }
    puVar14 = pbVar2[uVar8].qs;
    puVar12 = L + 0x20;
    for (uVar8 = 0; uVar8 < 0x100; uVar8 = uVar8 + 0x40) {
      for (lVar11 = 0; lVar11 != 0x20; lVar11 = lVar11 + 1) {
        puVar14[lVar11] = puVar12[lVar11] << 4 | puVar12[lVar11 + -0x20];
      }
      puVar14 = puVar14 + 0x20;
      puVar12 = puVar12 + 0x40;
    }
    x = local_220 + 0x100;
    puVar10 = puVar10 + 0x90;
  }
  return;
}

Assistant:

void quantize_row_q4_K_ref(const float * GGML_RESTRICT x, block_q4_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int nb = k / QK_K;

    uint8_t L[QK_K];
    uint8_t Laux[32];
    float   weights[32];
    float mins[QK_K/32];
    float scales[QK_K/32];

    for (int i = 0; i < nb; i++) {
        float max_scale = 0; // as we are deducting the min, scales are always positive
        float max_min = 0;
        for (int j = 0; j < QK_K/32; ++j) {
            //scales[j] = make_qkx1_quants(32, 15, x + 32*j, L + 32*j, &mins[j], 9, 0.5f);
            float sum_x2 = 0;
            for (int l = 0; l < 32; ++l) sum_x2 += x[32*j + l] * x[32*j + l];
            float av_x = sqrtf(sum_x2/32);
            for (int l = 0; l < 32; ++l) weights[l] = av_x + fabsf(x[32*j + l]);
            scales[j] = make_qkx2_quants(32, 15, x + 32*j, weights, L + 32*j, &mins[j], Laux, -1.f, 0.1f, 20, false);
            float scale = scales[j];
            if (scale > max_scale) {
                max_scale = scale;
            }
            float min = mins[j];
            if (min > max_min) {
                max_min = min;
            }
        }

        float inv_scale = max_scale > 0 ? 63.f/max_scale : 0.f;
        float inv_min   = max_min   > 0 ? 63.f/max_min   : 0.f;
        for (int j = 0; j < QK_K/32; ++j) {
            uint8_t ls = nearest_int(inv_scale*scales[j]);
            uint8_t lm = nearest_int(inv_min*mins[j]);
            ls = MIN(63, ls);
            lm = MIN(63, lm);
            if (j < 4) {
                y[i].scales[j] = ls;
                y[i].scales[j+4] = lm;
            } else {
                y[i].scales[j+4] = (ls & 0xF) | ((lm & 0xF) << 4);
                y[i].scales[j-4] |= ((ls >> 4) << 6);
                y[i].scales[j-0] |= ((lm >> 4) << 6);
            }
        }
        y[i].d = GGML_FP32_TO_FP16(max_scale/63.f);
        y[i].dmin = GGML_FP32_TO_FP16(max_min/63.f);

        uint8_t sc, m;
        for (int j = 0; j < QK_K/32; ++j) {
            get_scale_min_k4(j, y[i].scales, &sc, &m);
            const float d = GGML_FP16_TO_FP32(y[i].d) * sc;
            if (!d) continue;
            const float dm = GGML_FP16_TO_FP32(y[i].dmin) * m;
            for (int ii = 0; ii < 32; ++ii) {
                int l = nearest_int((x[32*j + ii] + dm)/d);
                l = MAX(0, MIN(15, l));
                L[32*j + ii] = l;
            }
        }

        uint8_t * q = y[i].qs;
        for (int j = 0; j < QK_K; j += 64) {
            for (int l = 0; l < 32; ++l) q[l] = L[j + l] | (L[j + l + 32] << 4);
            q += 32;
        }

        x += QK_K;
    }
}